

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

void __thiscall MD5::reset(MD5 *this)

{
  this->_finished = false;
  this->_count[0] = 0;
  this->_count[1] = 0;
  this->_state[0] = 0x67452301;
  this->_state[1] = 0xefcdab89;
  this->_state[2] = 0x98badcfe;
  this->_state[3] = 0x10325476;
  return;
}

Assistant:

void MD5::reset()
{

    _finished = false;
    /* reset number of bits. */
    _count[0] = _count[1] = 0;
    /* Load magic initialization constants. */
    _state[0] = 0x67452301;
    _state[1] = 0xefcdab89;
    _state[2] = 0x98badcfe;
    _state[3] = 0x10325476;
}